

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostic * __thiscall slang::ast::Compilation::addDiag(Compilation *this,Diagnostic *diag)

{
  bool bVar1;
  Diagnostic *pDVar2;
  Diagnostic *this_00;
  bool *in_RDI;
  ASTDiagMap *unaff_retaddr;
  Diagnostic *result;
  bool isNew;
  bool isError;
  anon_class_1_0_00000001 isSuppressed;
  Diagnostic *in_stack_ffffffffffffff28;
  Diagnostic *in_stack_ffffffffffffff30;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff38;
  byte local_1b;
  bool *isNew_00;
  Diagnostic *in_stack_fffffffffffffff8;
  
  if ((in_RDI[0x4db] & 1U) == 0) {
    isNew_00 = in_RDI;
    bVar1 = addDiag::anon_class_1_0_00000001::operator()
                      (in_stack_ffffffffffffff38,(Symbol *)in_stack_ffffffffffffff30);
    if (bVar1) {
      Diagnostic::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pDVar2 = (Diagnostic *)(in_RDI + 0x530);
    }
    else {
      bVar1 = Diagnostic::isError(in_stack_ffffffffffffff30);
      this_00 = (Diagnostic *)(in_RDI + 0x418);
      Diagnostic::Diagnostic(this_00,in_stack_ffffffffffffff28);
      pDVar2 = ASTDiagMap::add(unaff_retaddr,in_stack_fffffffffffffff8,isNew_00);
      Diagnostic::~Diagnostic(this_00);
      if (((local_1b & 1) != 0) && (bVar1)) {
        *(long *)(in_RDI + 0x4d0) = *(long *)(in_RDI + 0x4d0) + 1;
      }
    }
  }
  else {
    Diagnostic::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pDVar2 = (Diagnostic *)(in_RDI + 0x530);
  }
  return pDVar2;
}

Assistant:

Diagnostic& Compilation::addDiag(Diagnostic diag) {
    SLANG_ASSERT(!isFrozen());

    if (diagsDisabled) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    auto isSuppressed = [](const Symbol* symbol) {
        while (symbol) {
            if (symbol->kind == SymbolKind::GenerateBlock)
                return symbol->as<GenerateBlockSymbol>().isUninstantiated;

            auto scope = symbol->getParentScope();
            symbol = scope ? &scope->asSymbol() : nullptr;
        }
        return false;
    };

    // Filter out diagnostics that came from inside an uninstantiated generate block.
    SLANG_ASSERT(diag.symbol);
    SLANG_ASSERT(diag.location);
    if (isSuppressed(diag.symbol)) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    const bool isError = diag.isError();

    bool isNew;
    auto& result = diagMap.add(std::move(diag), isNew);
    if (isNew && isError)
        numErrors++;

    return result;
}